

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O2

int mbedtls_ssl_handshake_server_step(mbedtls_ssl_context *ssl)

{
  mbedtls_ecdhopt_curve g;
  _func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *p_Var1;
  _func_int_void_ptr_mbedtls_ssl_session_ptr *p_Var2;
  _func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *p_Var3;
  _func_int_void_ptr_mbedtls_ssl_session_ptr_uchar_ptr_size_t *p_Var4;
  int *piVar5;
  char cVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  mbedtls_ssl_key_cert *pmVar10;
  byte bVar11;
  uchar uVar12;
  ushort uVar13;
  ushort uVar14;
  uint cli_msg_seq;
  int iVar15;
  int iVar16;
  mbedtls_key_exchange_type_t mVar17;
  uint uVar18;
  mbedtls_md_type_t mVar19;
  mbedtls_pk_type_t mVar20;
  mbedtls_pk_context *pmVar21;
  time_t tVar22;
  size_t sVar23;
  mbedtls_ssl_session *pmVar24;
  mbedtls_ssl_ciphersuite_t *pmVar25;
  mbedtls_cipher_info_t *pmVar26;
  size_t sVar27;
  ulong uVar28;
  mbedtls_ecp_curve_info **ppmVar29;
  mbedtls_ecp_curve_info *pmVar30;
  ushort *puVar31;
  mbedtls_x509_crt **ppmVar32;
  mbedtls_ssl_handshake_params *pmVar33;
  ulong uVar34;
  ushort *puVar35;
  mbedtls_ssl_config *pmVar36;
  undefined2 uVar37;
  mbedtls_ecdhopt_curve *pmVar38;
  ulong uVar39;
  long lVar40;
  uint uVar41;
  mbedtls_ssl_key_cert *pmVar42;
  long lVar43;
  uchar *puVar44;
  uchar *puVar45;
  size_t *hash;
  ulong uVar46;
  mbedtls_x509_crt *pmVar47;
  int *piVar48;
  uchar *puVar49;
  long lVar50;
  bool bVar51;
  mbedtls_ssl_key_cert *local_150;
  uchar *local_148;
  long local_140;
  long local_138;
  size_t len;
  ulong local_120;
  size_t signature_len;
  int local_10c;
  undefined8 local_108;
  ulong local_100;
  char *local_f8;
  char **local_f0;
  uchar *local_e8;
  ushort *local_e0;
  char *local_d8;
  ulong local_d0;
  size_t tlen;
  size_t local_b8;
  undefined1 local_b0 [128];
  
  iVar16 = -0x7100;
  if (ssl->state == 0x10) {
    return -0x7100;
  }
  if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
    return -0x7100;
  }
  iVar15 = mbedtls_ssl_flush_output(ssl);
  if (iVar15 != 0) {
    return iVar15;
  }
  if ((((ssl->conf->field_0x174 & 2) != 0) && (ssl->handshake->retransmit_state == '\x01')) &&
     (iVar15 = mbedtls_ssl_resend(ssl), iVar15 != 0)) {
    return iVar15;
  }
  switch(ssl->state) {
  case 0:
    ssl->state = 1;
    break;
  case 1:
    while( true ) {
      if ((ssl->renego_status == 0) && (iVar16 = mbedtls_ssl_fetch_input(ssl,5), iVar16 != 0)) {
        return iVar16;
      }
      if (*ssl->in_hdr != '\x16') {
        return -0x7900;
      }
      mbedtls_ssl_read_version
                ((int *)&len,(int *)&signature_len,*(uint *)&ssl->conf->field_0x174 >> 1 & 1,
                 ssl->in_hdr + 1);
      if ((int)len < 3) {
        return -0x7900;
      }
      if (((ssl->conf->field_0x174 & 2) == 0) || (ssl->renego_status != 0)) goto LAB_00119642;
      puVar49 = ssl->in_ctr;
      if (*puVar49 != '\0') {
        return -0x7900;
      }
      if (puVar49[1] != '\0') {
        return -0x7900;
      }
      puVar44 = ssl->out_ctr;
      *(undefined2 *)(puVar44 + 6) = *(undefined2 *)(puVar49 + 6);
      *(undefined4 *)(puVar44 + 2) = *(undefined4 *)(puVar49 + 2);
      iVar16 = mbedtls_ssl_dtls_replay_check(ssl);
      if (iVar16 == 0) break;
      ssl->next_record_offset = 0;
      ssl->in_left = 0;
    }
    mbedtls_ssl_dtls_replay_update(ssl);
LAB_00119642:
    if (ssl->renego_status == 0) {
      uVar13 = *(ushort *)ssl->in_len << 8 | *(ushort *)ssl->in_len >> 8;
      sVar23 = (size_t)uVar13;
      if (0x4000 < uVar13) {
        return -0x7900;
      }
      iVar16 = mbedtls_ssl_fetch_input
                         (ssl,(ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4 + 5 + sVar23);
      if (iVar16 != 0) {
        return iVar16;
      }
      if ((ssl->conf->field_0x174 & 2) == 0) {
        ssl->in_left = 0;
      }
      else {
        ssl->next_record_offset = sVar23 + 0xd;
      }
    }
    else {
      sVar23 = ssl->in_hslen;
    }
    puVar49 = ssl->in_msg;
    (*ssl->handshake->update_checksum)(ssl,puVar49,sVar23);
    pmVar36 = ssl->conf;
    uVar18 = *(uint *)&pmVar36->field_0x174;
    uVar46 = (ulong)(uVar18 & 2) * 4 + 4;
    if (sVar23 < uVar46) {
      return -0x7900;
    }
    if (*puVar49 != '\x01') {
      return -0x7900;
    }
    if (puVar49[1] != '\0') {
      return -0x7900;
    }
    if (sVar23 != (ushort)(*(ushort *)(puVar49 + 2) << 8 | *(ushort *)(puVar49 + 2) >> 8) + uVar46)
    {
      return -0x7900;
    }
    if ((uVar18 & 2) == 0) {
      lVar43 = 4;
    }
    else {
      puVar44 = ssl->in_msg;
      pmVar33 = ssl->handshake;
      uVar18 = (uint)(ushort)(*(ushort *)(puVar44 + 4) << 8 | *(ushort *)(puVar44 + 4) >> 8);
      if (ssl->renego_status == 1) {
        if (uVar18 != pmVar33->in_msg_seq) {
          return -0x7900;
        }
      }
      else {
        pmVar33->out_msg_seq = uVar18;
      }
      pmVar33->in_msg_seq = uVar18 + 1;
      if (puVar44[6] != '\0') {
        return -0x7080;
      }
      if (puVar44[7] != '\0') {
        return -0x7080;
      }
      if (puVar44[8] != '\0') {
        return -0x7080;
      }
      iVar16 = bcmp(puVar44 + 1,puVar44 + 9,3);
      if (iVar16 != 0) {
        return -0x7080;
      }
      uVar18 = *(uint *)&pmVar36->field_0x174;
      lVar43 = (ulong)(uVar18 & 2) * 4 + 4;
    }
    uVar46 = sVar23 - lVar43;
    if (uVar46 < 0x26) {
      return -0x7900;
    }
    puVar44 = puVar49 + lVar43;
    piVar48 = &ssl->minor_ver;
    mbedtls_ssl_read_version(&ssl->major_ver,piVar48,uVar18 >> 1 & 1,puVar44);
    uVar18 = ssl->major_ver;
    pmVar33 = ssl->handshake;
    pmVar33->max_major_ver = uVar18;
    uVar41 = ssl->minor_ver;
    pmVar33->max_minor_ver = uVar41;
    pmVar36 = ssl->conf;
    if (((int)uVar18 < (int)(uint)pmVar36->min_major_ver) ||
       ((int)uVar41 < (int)(uint)pmVar36->min_minor_ver)) {
      mbedtls_ssl_send_alert_message(ssl,'\x02','F');
      return -0x6e80;
    }
    if (pmVar36->max_major_ver < uVar18) {
      ssl->major_ver = (uint)pmVar36->max_major_ver;
      bVar11 = pmVar36->max_minor_ver;
LAB_0011a030:
      *piVar48 = (uint)bVar11;
    }
    else {
      bVar11 = pmVar36->max_minor_ver;
      if (bVar11 < uVar41) goto LAB_0011a030;
    }
    uVar7 = *(undefined8 *)(puVar44 + 2);
    uVar8 = *(undefined8 *)(puVar44 + 10);
    uVar9 = *(undefined8 *)(puVar44 + 0x1a);
    *(undefined8 *)(pmVar33->randbytes + 0x10) = *(undefined8 *)(puVar44 + 0x12);
    *(undefined8 *)(pmVar33->randbytes + 0x18) = uVar9;
    *(undefined8 *)pmVar33->randbytes = uVar7;
    *(undefined8 *)(pmVar33->randbytes + 8) = uVar8;
    uVar28 = (ulong)puVar44[0x22];
    if ((uVar28 < 0x21) && (uVar34 = uVar28 + 0x24, uVar34 <= uVar46)) {
      pmVar24 = ssl->session_negotiate;
      pmVar24->id_len = uVar28;
      pmVar24->id[0] = '\0';
      pmVar24->id[1] = '\0';
      pmVar24->id[2] = '\0';
      pmVar24->id[3] = '\0';
      pmVar24->id[4] = '\0';
      pmVar24->id[5] = '\0';
      pmVar24->id[6] = '\0';
      pmVar24->id[7] = '\0';
      pmVar24->id[8] = '\0';
      pmVar24->id[9] = '\0';
      pmVar24->id[10] = '\0';
      pmVar24->id[0xb] = '\0';
      pmVar24->id[0xc] = '\0';
      pmVar24->id[0xd] = '\0';
      pmVar24->id[0xe] = '\0';
      pmVar24->id[0xf] = '\0';
      pmVar24->id[0x10] = '\0';
      pmVar24->id[0x11] = '\0';
      pmVar24->id[0x12] = '\0';
      pmVar24->id[0x13] = '\0';
      pmVar24->id[0x14] = '\0';
      pmVar24->id[0x15] = '\0';
      pmVar24->id[0x16] = '\0';
      pmVar24->id[0x17] = '\0';
      pmVar24->id[0x18] = '\0';
      pmVar24->id[0x19] = '\0';
      pmVar24->id[0x1a] = '\0';
      pmVar24->id[0x1b] = '\0';
      pmVar24->id[0x1c] = '\0';
      pmVar24->id[0x1d] = '\0';
      pmVar24->id[0x1e] = '\0';
      pmVar24->id[0x1f] = '\0';
      memcpy(ssl->session_negotiate->id,puVar44 + 0x23,ssl->session_negotiate->id_len);
      pmVar36 = ssl->conf;
      if ((pmVar36->field_0x174 & 2) == 0) {
        local_138 = uVar28 + 0x23;
      }
      else {
        uVar39 = (ulong)puVar44[uVar28 + 0x23];
        if (uVar46 < uVar34 + uVar39 + 2) {
          uVar12 = 'F';
          goto LAB_0011a0cb;
        }
        local_138 = uVar34 + uVar39;
        if ((pmVar36->f_cookie_check == (_func_int_void_ptr_uchar_ptr_size_t_uchar_ptr_size_t *)0x0)
           || (ssl->renego_status != 0)) {
          if (uVar39 != 0) {
            return -0x7900;
          }
        }
        else {
          iVar16 = (*pmVar36->f_cookie_check)
                             (pmVar36->p_cookie,puVar44 + uVar28 + 0x24,uVar39,ssl->cli_id,
                              ssl->cli_id_len);
          if (iVar16 == 0) {
            ssl->handshake->verify_cookie_len = '\0';
          }
          else {
            ssl->handshake->verify_cookie_len = '\x01';
          }
        }
      }
      local_100 = (ulong)CONCAT11(puVar44[local_138],puVar44[local_138 + 1]);
      if ((((1 < local_100) && ((puVar44[local_138 + 1] & 1) == 0)) &&
          (uVar28 = local_100 + local_138 + 2, uVar28 < uVar46)) &&
         (((byte)(puVar44[uVar28] - 1) < 0x10 &&
          (uVar28 = uVar28 + puVar44[uVar28], uVar28 < uVar46)))) {
        ssl->session_negotiate->compression = 0;
        local_108 = 0;
        if (uVar28 + 1 < uVar46) {
          if (((uVar46 < uVar28 + 3) ||
              (local_120 = (ulong)(ushort)(*(ushort *)(puVar44 + uVar28 + 1) << 8 |
                                          *(ushort *)(puVar44 + uVar28 + 1) >> 8),
              0xfffffffffffffffc < local_120 - 4)) || (uVar46 != uVar28 + 3 + local_120))
          goto LAB_0011a0c6;
        }
        else {
          local_120 = 0;
        }
        local_150 = (mbedtls_ssl_key_cert *)(puVar44 + uVar28 + 3);
        local_e8 = puVar44 + local_138;
        local_d8 = ssl->peer_verify_data;
        local_10c = 0;
        do {
          if (local_120 == 0) {
            local_e8 = local_e8 + 2;
            local_138 = local_138 + lVar43;
            uVar46 = 0;
            goto LAB_0011a839;
          }
          uVar13 = *(ushort *)((long)local_150 + 2) << 8 | *(ushort *)((long)local_150 + 2) >> 8;
          local_d0 = (ulong)(uVar13 + 4);
          bVar51 = local_120 < local_d0;
          local_120 = local_120 - local_d0;
          if (bVar51) break;
          uVar14 = *(ushort *)local_150 << 8 | *(ushort *)local_150 >> 8;
          uVar18 = (uint)uVar13;
          uVar46 = (ulong)uVar18;
          iVar16 = local_10c;
          if (uVar14 < 0x11) {
            uVar41 = (uint)uVar13;
            switch(uVar14) {
            case 0:
              p_Var3 = ssl->conf->f_sni;
              if (p_Var3 != (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0) {
                uVar13 = *(ushort *)((long)local_150 + 4) << 8 |
                         *(ushort *)((long)local_150 + 4) >> 8;
                uVar46 = (ulong)uVar13;
                if (uVar13 + 2 != uVar41) goto LAB_0011a0c6;
                puVar31 = (ushort *)((long)local_150 + 6);
                while (uVar46 != 0) {
                  uVar34 = (ulong)(ushort)(*(ushort *)((long)puVar31 + 1) << 8 |
                                          *(ushort *)((long)puVar31 + 1) >> 8);
                  uVar28 = uVar34 + 3;
                  bVar51 = uVar46 < uVar28;
                  uVar46 = uVar46 - uVar28;
                  if (bVar51) goto LAB_0011a0c6;
                  if ((uchar)*puVar31 == '\0') {
                    iVar15 = (*p_Var3)(ssl->conf->p_sni,ssl,(uchar *)((long)puVar31 + 3),uVar34);
                    iVar16 = local_10c;
                    if (iVar15 != 0) {
                      uVar12 = 'p';
                      goto LAB_0011a0cb;
                    }
                    break;
                  }
                  puVar31 = (ushort *)((long)puVar31 + uVar28);
                }
              }
              break;
            case 1:
              if ((uVar41 != 1) || (4 < (byte)*(ushort *)((long)local_150 + 4))) {
LAB_0011a855:
                uVar12 = '/';
                goto LAB_0011a0cb;
              }
              ssl->session_negotiate->mfl_code = (byte)*(ushort *)((long)local_150 + 4);
              break;
            case 4:
              if (uVar13 != 0) goto LAB_0011a0c6;
              if ((ssl->conf->field_0x175 & 0x80) != 0) {
                ssl->session_negotiate->trunc_hmac = 1;
              }
              break;
            case 10:
              bVar11 = *(byte *)((long)local_150 + 5);
              if ((((bVar11 & 1) != 0) ||
                  ((uint)(byte)*(ushort *)((long)local_150 + 4) * 0x100 + (uint)bVar11 + 2 != uVar18
                  )) || (pmVar33 = ssl->handshake, pmVar33->curves != (mbedtls_ecp_curve_info **)0x0
                        )) goto LAB_0011a0c6;
              uVar13 = CONCAT11((byte)*(ushort *)((long)local_150 + 4),bVar11);
              uVar46 = (ulong)(uVar13 >> 1);
              if (10 < uVar46) {
                uVar46 = 0xb;
              }
              uVar46 = uVar46 + 1;
              ppmVar29 = (mbedtls_ecp_curve_info **)calloc(uVar46,8);
              if (ppmVar29 == (mbedtls_ecp_curve_info **)0x0) {
                mbedtls_ssl_send_alert_message(ssl,'\x02','P');
                return -0x7f00;
              }
              pmVar33->curves = ppmVar29;
              uVar28 = 0;
              while ((iVar16 = local_10c, uVar13 != uVar28 && (1 < uVar46))) {
                uVar14 = *(ushort *)((long)local_150 + uVar28 + 6);
                pmVar30 = mbedtls_ecp_curve_info_from_tls_id(uVar14 << 8 | uVar14 >> 8);
                if (pmVar30 != (mbedtls_ecp_curve_info *)0x0) {
                  *ppmVar29 = pmVar30;
                  ppmVar29 = ppmVar29 + 1;
                  uVar46 = uVar46 - 1;
                }
                uVar28 = uVar28 + 2;
              }
              break;
            case 0xb:
              pmVar33 = ssl->handshake;
              piVar5 = &pmVar33->cli_exts;
              *piVar5 = *piVar5 | 1;
              if ((byte)*(ushort *)((long)local_150 + 4) + 1 != uVar41) goto LAB_0011a0c6;
              uVar46 = 0;
              do {
                if ((byte)*(ushort *)((long)local_150 + 4) == uVar46) goto switchD_0011a274_caseD_2;
                lVar40 = uVar46 + 5;
                uVar46 = uVar46 + 1;
                uVar18 = (uint)*(byte *)((long)local_150 + lVar40);
              } while (1 < uVar18);
              (pmVar33->ecdh_ctx).point_format = uVar18;
              break;
            case 0xd:
              if (((*(byte *)((long)local_150 + 5) & 1) != 0) ||
                 ((uint)*(byte *)((long)local_150 + 5) +
                  (uint)(byte)*(ushort *)((long)local_150 + 4) * 0x100 + 2 != uVar18))
              goto LAB_0011a0c6;
              for (puVar31 = (ushort *)((long)local_150 + 6); iVar16 = 1,
                  puVar31 < (ushort *)((long)local_150 + uVar46 + 4); puVar31 = puVar31 + 1) {
                mVar20 = mbedtls_ssl_pk_alg_from_sig(*(uchar *)((long)puVar31 + 1));
                if (((mVar20 != MBEDTLS_PK_NONE) &&
                    (mVar19 = mbedtls_ssl_md_alg_from_hash((uchar)*puVar31),
                    mVar19 != MBEDTLS_MD_NONE)) &&
                   (iVar16 = mbedtls_ssl_check_sig_hash(ssl,mVar19), iVar16 == 0)) {
                  mbedtls_ssl_sig_hash_set_add(&ssl->handshake->hash_algs,mVar20,mVar19);
                }
              }
              break;
            case 0x10:
              local_f0 = ssl->conf->alpn_list;
              if (local_f0 != (char **)0x0) {
                if ((3 < uVar41) &&
                   ((ulong)(ushort)(*(ushort *)((long)local_150 + 4) << 8 |
                                   *(ushort *)((long)local_150 + 4) >> 8) == uVar46 - 2)) {
                  puVar35 = (ushort *)((long)local_150 + uVar46 + 4);
                  local_e0 = (ushort *)((long)local_150 + 6);
                  for (puVar31 = local_e0; puVar31 != puVar35;
                      puVar31 = (ushort *)((byte *)((long)puVar31 + 1) + uVar46)) {
                    uVar46 = (ulong)(byte)*puVar31;
                    if ((ulong)((long)puVar35 - ((long)puVar31 + 1)) < uVar46) goto LAB_0011a0c6;
                    if (uVar46 == 0) goto LAB_0011a855;
                  }
                  for (; local_f8 = *local_f0, local_f8 != (char *)0x0; local_f0 = local_f0 + 1) {
                    sVar27 = strlen(local_f8);
                    for (puVar31 = local_e0; puVar31 != puVar35;
                        puVar31 = (ushort *)((byte *)((long)puVar31 + 1) + (byte)uVar13)) {
                      uVar13 = *puVar31;
                      if ((sVar27 == (byte)uVar13) &&
                         (iVar16 = bcmp((byte *)((long)puVar31 + 1),local_f8,sVar27), iVar16 == 0))
                      {
                        ssl->alpn_chosen = local_f8;
                        iVar16 = local_10c;
                        goto switchD_0011a274_caseD_2;
                      }
                    }
                  }
                  uVar12 = 'x';
                  goto LAB_0011a0cb;
                }
                goto LAB_0011a0c6;
              }
            }
          }
          else if (uVar14 == 0x16) {
            if (uVar18 != 0) break;
            if (((ssl->conf->field_0x175 & 4) != 0) && (*piVar48 != 0)) {
              ssl->session_negotiate->encrypt_then_mac = 1;
            }
          }
          else if (uVar14 == 0x17) {
            if (uVar13 != 0) break;
            if (((ssl->conf->field_0x175 & 8) != 0) && (*piVar48 != 0)) {
              ssl->handshake->extended_ms = 1;
            }
          }
          else if (uVar14 == 0x23) {
            mbedtls_ssl_session_init((mbedtls_ssl_session *)&tlen);
            pmVar36 = ssl->conf;
            p_Var4 = pmVar36->f_ticket_parse;
            iVar16 = local_10c;
            if ((((p_Var4 != (_func_int_void_ptr_mbedtls_ssl_session_ptr_uchar_ptr_size_t *)0x0) &&
                 (pmVar36->f_ticket_write !=
                  (_func_int_void_ptr_mbedtls_ssl_session_ptr_uchar_ptr_uchar_ptr_size_t_ptr_uint32_t_ptr
                   *)0x0)) && (ssl->handshake->new_session_ticket = 1, uVar13 != 0)) &&
               (ssl->renego_status == 0)) {
              iVar16 = (*p_Var4)(pmVar36->p_ticket,(mbedtls_ssl_session *)&tlen,
                                 (uchar *)((long)local_150 + 4),uVar46);
              if (iVar16 == 0) {
                pmVar24 = ssl->session_negotiate;
                local_b8 = pmVar24->id_len;
                memcpy(local_b0,pmVar24->id,local_b8);
                mbedtls_ssl_session_free(pmVar24);
                memcpy(ssl->session_negotiate,&tlen,0x98);
                for (lVar40 = -0x98; lVar40 != 0; lVar40 = lVar40 + 1) {
                  (&stack0xffffffffffffffd0)[lVar40] = 0;
                }
                pmVar33 = ssl->handshake;
                pmVar33->resume = 1;
                pmVar33->new_session_ticket = 0;
                iVar16 = local_10c;
              }
              else {
                mbedtls_ssl_session_free((mbedtls_ssl_session *)&tlen);
                iVar16 = local_10c;
              }
            }
          }
          else if (uVar14 == 0xff01) {
            if (ssl->renego_status == 0) {
              if ((uVar13 != 1) || ((uchar)*(ushort *)((long)local_150 + 4) != '\0'))
              goto LAB_0011a911;
              ssl->secure_renegotiation = 1;
              local_108 = 1;
            }
            else {
              sVar23 = ssl->verify_data_len;
              if ((sVar23 + 1 != uVar46) || (sVar23 != (byte)*(ushort *)((long)local_150 + 4)))
              goto LAB_0011a911;
              iVar15 = mbedtls_ssl_safer_memcmp((uchar *)((long)local_150 + 5),local_d8,sVar23);
              local_108 = 1;
              iVar16 = local_10c;
              if (iVar15 != 0) goto LAB_0011a911;
            }
          }
switchD_0011a274_caseD_2:
          local_10c = iVar16;
          local_150 = (mbedtls_ssl_key_cert *)((long)local_150 + local_d0);
        } while (2 < local_120 - 1);
      }
    }
LAB_0011a0c6:
    uVar12 = '2';
LAB_0011a0cb:
    mbedtls_ssl_send_alert_message(ssl,'\x02',uVar12);
    return -0x7900;
  case 2:
    uVar18 = *(uint *)&ssl->conf->field_0x174;
    if (((uVar18 & 2) != 0) && (ssl->handshake->verify_cookie_len != '\0')) {
      puVar49 = ssl->out_msg;
      mbedtls_ssl_write_version(ssl->major_ver,ssl->minor_ver,1,puVar49 + 4);
      p_Var1 = ssl->conf->f_cookie_write;
      if (p_Var1 == (_func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *)0x0) {
        return -0x6c00;
      }
      tlen = (size_t)(puVar49 + 7);
      iVar16 = (*p_Var1)(ssl->conf->p_cookie,(uchar **)&tlen,ssl->out_buf + 0x414d,ssl->cli_id,
                         ssl->cli_id_len);
      if (iVar16 != 0) {
        return iVar16;
      }
      puVar49[6] = (char)tlen - (char)(puVar49 + 7);
      ssl->out_msglen = tlen - (long)ssl->out_msg;
      ssl->out_msgtype = 0x16;
      *ssl->out_msg = '\x03';
      ssl->state = 0x12;
      goto LAB_00118e6c;
    }
    if (ssl->conf->f_rng == (mbedtls_ssl_recv_t *)0x0) {
      return -0x7400;
    }
    puVar49 = ssl->out_msg;
    mbedtls_ssl_write_version(ssl->major_ver,ssl->minor_ver,uVar18 >> 1 & 1,puVar49 + 4);
    tVar22 = time((time_t *)0x0);
    uVar18 = (uint)tVar22;
    *(uint *)(puVar49 + 6) =
         uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
    iVar16 = (*ssl->conf->f_rng)(ssl->conf->p_rng,puVar49 + 10,0x1c);
    if (iVar16 != 0) {
      return iVar16;
    }
    pmVar33 = ssl->handshake;
    uVar7 = *(undefined8 *)(puVar49 + 6);
    uVar8 = *(undefined8 *)(puVar49 + 0xe);
    uVar9 = *(undefined8 *)(puVar49 + 0x1e);
    *(undefined8 *)(pmVar33->randbytes + 0x30) = *(undefined8 *)(puVar49 + 0x16);
    *(undefined8 *)(pmVar33->randbytes + 0x38) = uVar9;
    *(undefined8 *)(pmVar33->randbytes + 0x20) = uVar7;
    *(undefined8 *)(pmVar33->randbytes + 0x28) = uVar8;
    if (ssl->handshake->resume != 0) goto LAB_0011930a;
    if ((ssl->renego_status == 0) && (ssl->session_negotiate->id_len != 0)) {
      p_Var2 = ssl->conf->f_get_cache;
      if (p_Var2 == (_func_int_void_ptr_mbedtls_ssl_session_ptr *)0x0) goto LAB_001197d7;
      iVar16 = (*p_Var2)(ssl->conf->p_cache,ssl->session_negotiate);
      if (iVar16 == 0) {
        ssl->handshake->resume = 1;
      }
      else if (ssl->handshake->resume == 0) goto LAB_001197d7;
LAB_0011930a:
      ssl->state = 0xc;
      iVar16 = mbedtls_ssl_derive_keys(ssl);
LAB_00119319:
      if (iVar16 != 0) {
        return iVar16;
      }
    }
    else {
LAB_001197d7:
      ssl->state = ssl->state + 1;
      tVar22 = time((time_t *)0x0);
      pmVar24 = ssl->session_negotiate;
      pmVar24->start = tVar22;
      if (ssl->handshake->new_session_ticket == 0) {
        pmVar24->id_len = 0x20;
        iVar16 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar24->id,0x20);
        goto LAB_00119319;
      }
      pmVar24->id[8] = '\0';
      pmVar24->id[9] = '\0';
      pmVar24->id[10] = '\0';
      pmVar24->id[0xb] = '\0';
      pmVar24->id[0xc] = '\0';
      pmVar24->id[0xd] = '\0';
      pmVar24->id[0xe] = '\0';
      pmVar24->id[0xf] = '\0';
      pmVar24->id[0x10] = '\0';
      pmVar24->id[0x11] = '\0';
      pmVar24->id[0x12] = '\0';
      pmVar24->id[0x13] = '\0';
      pmVar24->id[0x14] = '\0';
      pmVar24->id[0x15] = '\0';
      pmVar24->id[0x16] = '\0';
      pmVar24->id[0x17] = '\0';
      pmVar24->id_len = 0;
      pmVar24->id[0] = '\0';
      pmVar24->id[1] = '\0';
      pmVar24->id[2] = '\0';
      pmVar24->id[3] = '\0';
      pmVar24->id[4] = '\0';
      pmVar24->id[5] = '\0';
      pmVar24->id[6] = '\0';
      pmVar24->id[7] = '\0';
      pmVar24->id[0x18] = '\0';
      pmVar24->id[0x19] = '\0';
      pmVar24->id[0x1a] = '\0';
      pmVar24->id[0x1b] = '\0';
      pmVar24->id[0x1c] = '\0';
      pmVar24->id[0x1d] = '\0';
      pmVar24->id[0x1e] = '\0';
      pmVar24->id[0x1f] = '\0';
    }
    puVar49[0x26] = (uchar)ssl->session_negotiate->id_len;
    memcpy(puVar49 + 0x27,ssl->session_negotiate->id,ssl->session_negotiate->id_len);
    sVar23 = ssl->session_negotiate->id_len;
    puVar45 = puVar49 + sVar23 + 0x27;
    *puVar45 = *(uchar *)((long)&ssl->session_negotiate->ciphersuite + 1);
    puVar49[sVar23 + 0x28] = (uchar)ssl->session_negotiate->ciphersuite;
    puVar49[sVar23 + 0x29] = (uchar)ssl->session_negotiate->compression;
    puVar44 = puVar49 + sVar23 + 0x2c;
    if (ssl->secure_renegotiation == 1) {
      (puVar49 + sVar23 + 0x2c)[0] = 0xff;
      (puVar49 + sVar23 + 0x2c)[1] = '\x01';
      iVar16 = ssl->renego_status;
      puVar49[sVar23 + 0x2e] = '\0';
      if (iVar16 == 0) {
        (puVar49 + sVar23 + 0x2f)[0] = '\x01';
        (puVar49 + sVar23 + 0x2f)[1] = '\0';
        puVar45 = puVar49 + sVar23 + 0x31;
      }
      else {
        puVar49[sVar23 + 0x2f] = (char)ssl->verify_data_len * '\x02' + '\x01';
        puVar49[sVar23 + 0x30] = (char)ssl->verify_data_len * '\x02';
        memcpy(puVar49 + sVar23 + 0x31,ssl->peer_verify_data,ssl->verify_data_len);
        sVar27 = ssl->verify_data_len;
        memcpy(puVar45 + sVar27 + 10,ssl->own_verify_data,sVar27);
        puVar45 = puVar45 + sVar27 + 10 + ssl->verify_data_len;
      }
      lVar43 = (long)puVar45 - (long)puVar44;
    }
    else {
      lVar43 = 0;
    }
    pmVar24 = ssl->session_negotiate;
    if (pmVar24->mfl_code == '\0') {
      lVar40 = 0;
    }
    else {
      puVar45 = puVar44 + lVar43;
      puVar45[0] = '\0';
      puVar45[1] = '\x01';
      puVar45[2] = '\0';
      puVar45[3] = '\x01';
      puVar49[lVar43 + sVar23 + 0x30] = ssl->session_negotiate->mfl_code;
      pmVar24 = ssl->session_negotiate;
      lVar40 = 5;
    }
    if (pmVar24->trunc_hmac == 0) {
      lVar50 = 0;
    }
    else {
      lVar50 = 4;
      puVar45 = puVar44 + lVar40 + lVar43;
      puVar45[0] = '\0';
      puVar45[1] = '\x04';
      puVar45[2] = '\0';
      puVar45[3] = '\0';
      pmVar24 = ssl->session_negotiate;
    }
    lVar50 = lVar50 + lVar40 + lVar43;
    if ((((pmVar24->encrypt_then_mac == 0) || (ssl->minor_ver == 0)) ||
        (pmVar25 = mbedtls_ssl_ciphersuite_from_id(pmVar24->ciphersuite),
        pmVar25 == (mbedtls_ssl_ciphersuite_t *)0x0)) ||
       ((pmVar26 = mbedtls_cipher_info_from_type(pmVar25->cipher),
        pmVar26 == (mbedtls_cipher_info_t *)0x0 || (pmVar26->mode != MBEDTLS_MODE_CBC)))) {
      lVar43 = 0;
    }
    else {
      puVar45 = puVar44 + lVar50;
      puVar45[0] = '\0';
      puVar45[1] = '\x16';
      puVar45[2] = '\0';
      puVar45[3] = '\0';
      lVar43 = 4;
    }
    lVar43 = lVar43 + lVar50;
    pmVar33 = ssl->handshake;
    if ((pmVar33->extended_ms == 0) || (ssl->minor_ver == 0)) {
      lVar40 = 0;
    }
    else {
      puVar45 = puVar44 + lVar43;
      puVar45[0] = '\0';
      puVar45[1] = '\x17';
      puVar45[2] = '\0';
      puVar45[3] = '\0';
      pmVar33 = ssl->handshake;
      lVar40 = 4;
    }
    lVar40 = lVar40 + lVar43;
    if (pmVar33->new_session_ticket == 0) {
      lVar43 = 0;
    }
    else {
      puVar45 = puVar44 + lVar40;
      puVar45[0] = '\0';
      puVar45[1] = '#';
      puVar45[2] = '\0';
      puVar45[3] = '\0';
      pmVar33 = ssl->handshake;
      lVar43 = 4;
    }
    lVar43 = lVar43 + lVar40;
    if ((pmVar33->cli_exts & 1) == 0) {
      lVar40 = 0;
    }
    else {
      puVar45 = puVar44 + lVar43;
      puVar45[0] = '\0';
      puVar45[1] = '\v';
      puVar45[2] = '\0';
      puVar45[3] = '\x02';
      (puVar49 + lVar43 + sVar23 + 0x30)[0] = '\x01';
      (puVar49 + lVar43 + sVar23 + 0x30)[1] = '\0';
      lVar40 = 6;
    }
    lVar40 = lVar40 + lVar43;
    if (ssl->alpn_chosen == (char *)0x0) {
      lVar43 = 0;
    }
    else {
      puVar45 = puVar44 + lVar40;
      puVar45[0] = '\0';
      puVar45[1] = '\x10';
      sVar27 = strlen(ssl->alpn_chosen);
      lVar43 = sVar27 + 7;
      puVar49[lVar40 + sVar23 + 0x2e] = (uchar)((uint)((int)sVar27 + 3) >> 8);
      cVar6 = (char)lVar43;
      puVar45[3] = cVar6 + 0xfc;
      puVar49[lVar40 + sVar23 + 0x30] = (uchar)((uint)((int)sVar27 + 1) >> 8);
      puVar45[5] = cVar6 + 0xfa;
      puVar45[6] = cVar6 + 0xf9;
      memcpy(puVar45 + 7,ssl->alpn_chosen,sVar27);
    }
    lVar43 = lVar43 + lVar40;
    if (lVar43 == 0) {
      puVar44 = puVar49 + sVar23 + 0x2a;
    }
    else {
      *(ushort *)(puVar49 + sVar23 + 0x2a) = (ushort)lVar43 << 8 | (ushort)lVar43 >> 8;
      puVar44 = puVar44 + lVar43;
    }
    ssl->out_msglen = (long)puVar44 - (long)puVar49;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x02';
    goto LAB_00119b39;
  case 3:
    iVar16 = mbedtls_ssl_write_certificate(ssl);
    return iVar16;
  case 4:
    puVar49 = ssl->out_msg;
    pmVar25 = ssl->transform_negotiate->ciphersuite_info;
    mVar17 = pmVar25->key_exchange;
    if (0xfffffffd < mVar17 - MBEDTLS_KEY_EXCHANGE_ECJPAKE) {
      pmVar21 = mbedtls_ssl_own_key(ssl);
      iVar16 = mbedtls_pk_can_do(pmVar21,MBEDTLS_PK_ECKEY);
      if (iVar16 != 0) {
        pmVar33 = ssl->handshake;
        pmVar21 = mbedtls_ssl_own_key(ssl);
        mbedtls_ecdhopt_use_static_key
                  (&pmVar33->ecdh_ctx,(mbedtls_ecp_keypair *)pmVar21->pk_ctx,MBEDTLS_ECDH_OURS);
      }
      mVar17 = pmVar25->key_exchange;
    }
    puVar44 = puVar49 + 4;
    lVar43 = 0;
    puVar45 = puVar44;
    if (MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA < mVar17) {
LAB_00119362:
      if ((mVar17 - MBEDTLS_KEY_EXCHANGE_DHE_RSA & 0xfffffffb) == 0) {
        pmVar36 = ssl->conf;
        if ((pmVar36->dhm_P).p == (mbedtls_mpi_uint *)0x0) {
          return -0x7100;
        }
        if ((pmVar36->dhm_G).p == (mbedtls_mpi_uint *)0x0) {
          return -0x7100;
        }
        iVar16 = mbedtls_dhm_set_group(&ssl->handshake->dhm_ctx,&pmVar36->dhm_P,&pmVar36->dhm_G);
        if (iVar16 != 0) {
          return iVar16;
        }
        pmVar33 = ssl->handshake;
        sVar23 = mbedtls_mpi_size(&(pmVar33->dhm_ctx).P);
        iVar16 = mbedtls_dhm_make_params
                           (&pmVar33->dhm_ctx,(int)sVar23,puVar45,&len,
                            (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng
                           );
        if (iVar16 != 0) {
          return iVar16;
        }
        sVar23 = CONCAT44(len._4_4_,(int)len);
        puVar49 = puVar45 + sVar23;
        lVar43 = lVar43 + sVar23;
        mVar17 = pmVar25->key_exchange;
        puVar44 = puVar45;
      }
      else {
        sVar23 = 0;
        puVar49 = puVar45;
      }
      local_148 = puVar49;
      if ((mVar17 < MBEDTLS_KEY_EXCHANGE_ECDH_RSA) && ((0x118U >> (mVar17 & 0x1f) & 1) != 0)) {
        pmVar36 = ssl->conf;
        ppmVar29 = (mbedtls_ecp_curve_info **)0x0;
        for (pmVar38 = pmVar36->curve_list; g = *pmVar38, g != MBEDTLS_ECP_DP_NONE;
            pmVar38 = pmVar38 + 1) {
          pmVar33 = ssl->handshake;
          for (ppmVar29 = pmVar33->curves; *ppmVar29 != (mbedtls_ecp_curve_info *)0x0;
              ppmVar29 = ppmVar29 + 1) {
            if ((*ppmVar29)->grp_id == g) goto LAB_00119b7e;
          }
        }
        if (ppmVar29 == (mbedtls_ecp_curve_info **)0x0) {
          return -0x7380;
        }
        if (*ppmVar29 == (mbedtls_ecp_curve_info *)0x0) {
          return -0x7380;
        }
        pmVar33 = ssl->handshake;
LAB_00119b7e:
        iVar16 = mbedtls_ecdhopt_initiator
                           (&pmVar33->ecdh_ctx,g,&len,puVar49,0x4000 - lVar43,
                            (_func_int_void_ptr_uchar_ptr_size_t *)pmVar36->f_rng,pmVar36->p_rng);
        if (iVar16 != 0) {
          return iVar16;
        }
        sVar23 = CONCAT44(len._4_4_,(int)len);
        lVar43 = lVar43 + sVar23;
        mVar17 = pmVar25->key_exchange;
        local_148 = puVar49 + sVar23;
        puVar44 = puVar49;
      }
      if (0xfffffffc < mVar17 - MBEDTLS_KEY_EXCHANGE_PSK) {
        signature_len = 0;
        mVar20 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(pmVar25);
        if (ssl->minor_ver == 3) {
          if (mVar20 == MBEDTLS_PK_NONE) {
            return -0x6c00;
          }
          mVar19 = mbedtls_ssl_sig_hash_set_find(&ssl->handshake->hash_algs,mVar20);
          if (mVar19 == MBEDTLS_MD_NONE) {
            return -0x6c00;
          }
LAB_00119c3e:
          iVar16 = mbedtls_ssl_get_key_exchange_md_tls1_2(ssl,(uchar *)&tlen,puVar44,sVar23,mVar19);
          if (iVar16 != 0) {
            return iVar16;
          }
          sVar23 = 0;
        }
        else {
          if (pmVar25->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA) {
            mVar19 = MBEDTLS_MD_SHA1;
            goto LAB_00119c3e;
          }
          iVar16 = mbedtls_ssl_get_key_exchange_md_ssl_tls(ssl,(uchar *)&tlen,puVar44,sVar23);
          if (iVar16 != 0) {
            return iVar16;
          }
          sVar23 = 0x24;
          mVar19 = MBEDTLS_MD_NONE;
        }
        pmVar21 = mbedtls_ssl_own_key(ssl);
        if (pmVar21 == (mbedtls_pk_context *)0x0) {
          return -0x7600;
        }
        if (ssl->minor_ver == 3) {
          uVar12 = mbedtls_ssl_hash_from_md_alg(mVar19);
          *local_148 = uVar12;
          uVar12 = mbedtls_ssl_sig_from_pk_alg(mVar20);
          local_148[1] = uVar12;
          local_148 = local_148 + 2;
          lVar43 = lVar43 + 2;
        }
        pmVar21 = mbedtls_ssl_own_key(ssl);
        iVar16 = mbedtls_pk_sign(pmVar21,mVar19,(uchar *)&tlen,sVar23,local_148 + 2,&signature_len,
                                 (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,
                                 ssl->conf->p_rng);
        if (iVar16 != 0) {
          return iVar16;
        }
        *local_148 = signature_len._1_1_;
        local_148[1] = (uchar)signature_len;
        lVar43 = lVar43 + signature_len + 2;
      }
      ssl->out_msglen = lVar43 + 4;
      ssl->out_msgtype = 0x16;
      *ssl->out_msg = '\f';
      ssl->state = ssl->state + 1;
LAB_00118e6c:
      iVar16 = mbedtls_ssl_write_record(ssl);
      return iVar16;
    }
    if ((0x6a2U >> (mVar17 & 0x1f) & 1) == 0) {
      if ((0x140U >> (mVar17 & 0x1f) & 1) != 0) {
        puVar49[4] = '\0';
        puVar49[5] = '\0';
        lVar43 = 2;
        mVar17 = pmVar25->key_exchange;
        puVar45 = puVar49 + 6;
      }
      goto LAB_00119362;
    }
    goto LAB_00118d97;
  case 5:
    pmVar25 = ssl->transform_negotiate->ciphersuite_info;
    puVar49 = ssl->out_msg;
    ssl->state = 6;
    uVar18 = ssl->handshake->sni_authmode;
    if (uVar18 == 3) {
      uVar18 = *(uint *)&ssl->conf->field_0x174 >> 2 & 3;
    }
    mVar17 = pmVar25->key_exchange;
    if (mVar17 - MBEDTLS_KEY_EXCHANGE_PSK < 4) {
      return 0;
    }
    if (mVar17 == MBEDTLS_KEY_EXCHANGE_ECJPAKE) {
      return 0;
    }
    if (uVar18 == 0) {
      return 0;
    }
    puVar49[6] = '@';
    puVar49[4] = '\x02';
    puVar49[5] = '\x01';
    if (ssl->minor_ver == 3) {
      lVar43 = 0;
      for (piVar48 = ssl->conf->sig_hashes; *piVar48 != 0; piVar48 = piVar48 + 1) {
        bVar11 = mbedtls_ssl_hash_from_md_alg(*piVar48);
        if ((bVar11 != 0) &&
           (iVar16 = mbedtls_ssl_set_calc_verify_md(ssl,(uint)bVar11), iVar16 == 0)) {
          puVar49[lVar43 + 9] = bVar11;
          puVar49[lVar43 + 10] = '\x01';
          puVar49[lVar43 + 0xb] = bVar11;
          puVar49[lVar43 + 0xc] = '\x03';
          lVar43 = lVar43 + 4;
        }
      }
      *(ushort *)(puVar49 + 7) = (ushort)lVar43 << 8 | (ushort)lVar43 >> 8;
      local_140 = lVar43 + 2;
      lVar43 = lVar43 + 0xb;
    }
    else {
      lVar43 = 9;
      local_140 = 0;
    }
    if ((ssl->conf->field_0x176 & 4) == 0) {
      puVar44 = puVar49 + lVar43;
      uVar37 = 0;
    }
    else {
      pmVar47 = ssl->handshake->sni_ca_chain;
      if (pmVar47 == (mbedtls_x509_crt *)0x0) {
        ppmVar32 = &ssl->conf->ca_chain;
        lVar40 = 0;
        goto LAB_0011ac1c;
      }
      lVar40 = 0;
      while( true ) {
        uVar37 = (undefined2)lVar40;
        puVar44 = puVar49 + lVar43;
        if (((pmVar47 == (mbedtls_x509_crt *)0x0) || (pmVar47->version == 0)) || (0x4000 < lVar43))
        break;
        uVar46 = (pmVar47->subject_raw).len;
        if ((0x4000U - lVar43 < uVar46) || (0x4000U - lVar43 < uVar46 + 2)) break;
        *(ushort *)(puVar49 + lVar43) = (ushort)uVar46 << 8 | (ushort)uVar46 >> 8;
        memcpy((ushort *)((long)(puVar49 + lVar43) + 2),(pmVar47->subject_raw).p,uVar46);
        lVar43 = lVar43 + uVar46 + 2;
        lVar40 = lVar40 + uVar46 + 2;
        ppmVar32 = &pmVar47->next;
LAB_0011ac1c:
        pmVar47 = *ppmVar32;
      }
    }
    ssl->out_msglen = (long)puVar44 - (long)puVar49;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\r';
    ssl->out_msg[local_140 + 7] = (uchar)((ushort)uVar37 >> 8);
    ssl->out_msg[local_140 + 8] = (uchar)uVar37;
    goto LAB_00119b39;
  case 6:
    ssl->out_msglen = 4;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x0e';
    ssl->state = ssl->state + 1;
    if ((ssl->conf->field_0x174 & 2) != 0) {
      mbedtls_ssl_send_flight_completed(ssl);
    }
LAB_00119b39:
    iVar16 = mbedtls_ssl_write_record(ssl);
    return iVar16;
  case 7:
    iVar16 = mbedtls_ssl_parse_certificate(ssl);
    return iVar16;
  case 8:
    pmVar25 = ssl->transform_negotiate->ciphersuite_info;
    iVar16 = mbedtls_ssl_read_record(ssl);
    if (iVar16 != 0) {
      return iVar16;
    }
    puVar49 = ssl->in_msg;
    uVar46 = (ulong)(*(uint *)&ssl->conf->field_0x174 & 2);
    tlen = (size_t)(puVar49 + uVar46 * 4 + 4);
    if (ssl->in_msgtype != 0x16) {
      return -0x7c00;
    }
    if (*puVar49 != '\x10') {
      return -0x7c00;
    }
    mVar17 = pmVar25->key_exchange;
    if (9 < mVar17 - MBEDTLS_KEY_EXCHANGE_RSA) {
      return -0x6c00;
    }
    puVar49 = puVar49 + ssl->in_hslen;
    switch(mVar17) {
    case MBEDTLS_KEY_EXCHANGE_RSA:
      iVar16 = ssl_parse_encrypted_pms(ssl,(uchar *)tlen,puVar49,0);
      iVar15 = iVar16;
      goto joined_r0x0011927b;
    case MBEDTLS_KEY_EXCHANGE_DHE_RSA:
      iVar16 = ssl_parse_client_dh_public(ssl,(uchar **)&tlen,puVar49);
      if (iVar16 != 0) {
        return iVar16;
      }
      if ((uchar *)tlen != puVar49) {
        return -0x7c00;
      }
      pmVar33 = ssl->handshake;
      iVar15 = mbedtls_dhm_calc_secret
                         (&pmVar33->dhm_ctx,pmVar33->premaster,0x424,&pmVar33->pmslen,
                          (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
      break;
    default:
      iVar16 = mbedtls_ecdhopt_read_responder
                         (&ssl->handshake->ecdh_ctx,(uchar *)tlen,ssl->in_hslen - (uVar46 * 4 + 4));
      if (iVar16 != 0) {
        return -0x7c80;
      }
      pmVar33 = ssl->handshake;
      iVar15 = mbedtls_ecdhopt_shared_secret
                         (&pmVar33->ecdh_ctx,&pmVar33->pmslen,pmVar33->premaster,0x400,
                          (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
      break;
    case MBEDTLS_KEY_EXCHANGE_PSK:
      iVar16 = ssl_parse_client_psk_identity(ssl,(uchar **)&tlen,puVar49);
      goto LAB_00119e24;
    case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
      iVar16 = ssl_parse_client_psk_identity(ssl,(uchar **)&tlen,puVar49);
      if (iVar16 != 0) {
        return iVar16;
      }
      iVar16 = ssl_parse_client_dh_public(ssl,(uchar **)&tlen,puVar49);
LAB_00119e24:
      if (iVar16 != 0) {
        return iVar16;
      }
      if ((uchar *)tlen != puVar49) {
        return -0x7c00;
      }
LAB_00119e75:
      iVar16 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar25->key_exchange);
      iVar15 = iVar16;
      goto joined_r0x0011927b;
    case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
      iVar16 = ssl_parse_client_psk_identity(ssl,(uchar **)&tlen,puVar49);
      if (iVar16 != 0) {
        return iVar16;
      }
      iVar16 = ssl_parse_encrypted_pms(ssl,(uchar *)tlen,puVar49,2);
      iVar15 = iVar16;
      goto joined_r0x00119d6b;
    case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
      iVar16 = ssl_parse_client_psk_identity(ssl,(uchar **)&tlen,puVar49);
      if (iVar16 != 0) {
        return iVar16;
      }
      iVar15 = mbedtls_ecdhopt_read_responder
                         (&ssl->handshake->ecdh_ctx,(uchar *)tlen,(long)puVar49 - tlen);
      iVar16 = -0x7c80;
joined_r0x00119d6b:
      if (iVar15 != 0) {
        return iVar16;
      }
      goto LAB_00119e75;
    }
    iVar16 = -32000;
joined_r0x0011927b:
    if (iVar15 != 0) {
      return iVar16;
    }
    iVar16 = mbedtls_ssl_derive_keys(ssl);
    if (iVar16 != 0) {
      return iVar16;
    }
LAB_00118d97:
    ssl->state = ssl->state + 1;
    break;
  case 9:
    mVar17 = ssl->transform_negotiate->ciphersuite_info->key_exchange;
    if (((mVar17 < (MBEDTLS_KEY_EXCHANGE_ECDHE_PSK|MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA)) &&
        ((0x9e0U >> (mVar17 & 0x1f) & 1) != 0)) ||
       (ssl->session_negotiate->peer_cert == (mbedtls_x509_crt *)0x0)) {
      ssl->state = 10;
    }
    else {
      do {
        do {
          iVar16 = mbedtls_ssl_read_record_layer(ssl);
        } while (iVar16 == -0x6580);
        if (iVar16 != 0) {
          return iVar16;
        }
        iVar16 = mbedtls_ssl_handle_message_type(ssl);
      } while ((iVar16 == -0x6680) || (iVar16 == -0x6580));
      if (iVar16 != 0) {
        return iVar16;
      }
      ssl->state = ssl->state + 1;
      if (ssl->in_msgtype != 0x16) {
        return -0x7d80;
      }
      if (*ssl->in_msg != '\x0f') {
        return -0x7d80;
      }
      lVar43 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8;
      uVar46 = lVar43 + 4;
      if (ssl->minor_ver == 3) {
        if (ssl->in_hslen < (uVar46 | 2)) {
          return -0x7d80;
        }
        mVar19 = mbedtls_ssl_md_alg_from_hash(ssl->in_msg[uVar46]);
        if (mVar19 == MBEDTLS_MD_NONE) {
          return -0x7d80;
        }
        iVar16 = mbedtls_ssl_set_calc_verify_md(ssl,(uint)ssl->in_msg[uVar46]);
        if (iVar16 != 0) {
          return -0x7d80;
        }
        mVar20 = mbedtls_ssl_pk_alg_from_sig(ssl->in_msg[lVar43 + 5]);
        if (mVar20 == MBEDTLS_PK_NONE) {
          return -0x7d80;
        }
        iVar16 = mbedtls_pk_can_do(&ssl->session_negotiate->peer_cert->pk,mVar20);
        if (iVar16 == 0) {
          return -0x7d80;
        }
        hash = &tlen + (ulong)(mVar19 == MBEDTLS_MD_SHA1) * 2;
        local_148 = (uchar *)0x0;
        uVar46 = uVar46 | 2;
      }
      else {
        mVar19 = MBEDTLS_MD_SHA1;
        iVar16 = mbedtls_pk_can_do(&ssl->session_negotiate->peer_cert->pk,MBEDTLS_PK_ECDSA);
        if (iVar16 == 0) {
          mVar19 = MBEDTLS_MD_NONE;
          local_148 = (uchar *)0x24;
          hash = &tlen;
        }
        else {
          local_148 = (uchar *)0x14;
          hash = &local_b8;
        }
      }
      uVar28 = uVar46 + 2;
      if (ssl->in_hslen < uVar28) {
        return -0x7d80;
      }
      uVar46 = (ulong)(ushort)(*(ushort *)(ssl->in_msg + uVar46) << 8 |
                              *(ushort *)(ssl->in_msg + uVar46) >> 8);
      if (uVar46 + uVar28 != ssl->in_hslen) {
        return -0x7d80;
      }
      (*ssl->handshake->calc_verify)(ssl,(uchar *)&tlen);
      iVar16 = mbedtls_pk_verify(&ssl->session_negotiate->peer_cert->pk,mVar19,(uchar *)hash,
                                 (size_t)local_148,ssl->in_msg + uVar28,uVar46);
      if (iVar16 != 0) {
        return iVar16;
      }
      mbedtls_ssl_update_handshake_status(ssl);
    }
    break;
  case 10:
    iVar16 = mbedtls_ssl_parse_change_cipher_spec(ssl);
    return iVar16;
  case 0xb:
    iVar16 = mbedtls_ssl_parse_finished(ssl);
    return iVar16;
  case 0xc:
    if (ssl->handshake->new_session_ticket == 0) {
      iVar16 = mbedtls_ssl_write_change_cipher_spec(ssl);
      return iVar16;
    }
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x04';
    iVar16 = (*ssl->conf->f_ticket_write)
                       (ssl->conf->p_ticket,ssl->session_negotiate,ssl->out_msg + 10,
                        ssl->out_msg + 0x4000,&tlen,(uint32_t *)&len);
    if (iVar16 != 0) {
      tlen = 0;
    }
    ssl->out_msg[4] = (uchar)((uint)(int)len >> 0x18);
    ssl->out_msg[5] = (uchar)((uint)(int)len >> 0x10);
    ssl->out_msg[6] = (uchar)((uint)(int)len >> 8);
    ssl->out_msg[7] = (uchar)(int)len;
    ssl->out_msg[8] = (uchar)(tlen >> 8);
    ssl->out_msg[9] = (uchar)tlen;
    ssl->out_msglen = tlen + 10;
    ssl->handshake->new_session_ticket = 0;
    goto LAB_00118e6c;
  case 0xd:
    iVar16 = mbedtls_ssl_write_finished(ssl);
    return iVar16;
  case 0xe:
    ssl->state = 0xf;
    break;
  case 0xf:
    mbedtls_ssl_handshake_wrapup(ssl);
    break;
  default:
    goto switchD_00118ce0_caseD_10;
  case 0x12:
    iVar16 = -0x6a80;
    goto switchD_00118ce0_caseD_10;
  }
  iVar16 = 0;
switchD_00118ce0_caseD_10:
  return iVar16;
LAB_0011a839:
  if (local_100 <= uVar46) goto LAB_0011a878;
  if ((puVar49[uVar46 + local_138 + 2] == 'V') && (puVar49[uVar46 + local_138 + 3] == '\0')) {
    if (ssl->minor_ver < (int)(uint)ssl->conf->max_minor_ver) {
      uVar12 = 'V';
      goto LAB_0011a0cb;
    }
    goto LAB_0011a878;
  }
  uVar46 = uVar46 + 2;
  goto LAB_0011a839;
LAB_0011a878:
  if (local_10c == 0) {
    iVar16 = mbedtls_ssl_check_sig_hash(ssl,MBEDTLS_MD_SHA1);
    mbedtls_ssl_sig_hash_set_const_hash(&ssl->handshake->hash_algs,(uint)(iVar16 == 0) << 2);
  }
  for (uVar46 = 0; uVar46 < local_100; uVar46 = uVar46 + 2) {
    if ((puVar49[uVar46 + local_138 + 2] == '\0') && (puVar49[uVar46 + local_138 + 3] == 0xff)) {
      if (ssl->renego_status == 1) goto LAB_0011a911;
      ssl->secure_renegotiation = 1;
      goto LAB_0011a925;
    }
  }
  iVar16 = ssl->secure_renegotiation;
  if ((iVar16 == 1) || ((*(uint *)&ssl->conf->field_0x174 & 0x30) != 0x20)) {
    if (ssl->renego_status != 1) {
LAB_0011a925:
      pmVar36 = ssl->conf;
LAB_0011a928:
      piVar5 = pmVar36->ciphersuite_list[*piVar48];
      local_148 = (uchar *)0x0;
      bVar51 = false;
      do {
        if (piVar5[(long)local_148] == 0) {
          mbedtls_ssl_send_alert_message(ssl,'\x02','(');
          if (!bVar51) {
            return -0x7380;
          }
          return -0x6980;
        }
        puVar49 = local_e8;
        for (uVar46 = 0; uVar46 < local_100; uVar46 = uVar46 + 2) {
          iVar16 = piVar5[(long)local_148];
          if ((*puVar49 == (uchar)((uint)iVar16 >> 8)) && (puVar49[1] == (uchar)iVar16)) {
            pmVar25 = mbedtls_ssl_ciphersuite_from_id(iVar16);
            if (pmVar25 == (mbedtls_ssl_ciphersuite_t *)0x0) {
              return -0x6c00;
            }
            bVar51 = true;
            if ((((pmVar25->min_minor_ver <= *piVar48) && (*piVar48 <= pmVar25->max_minor_ver)) &&
                ((uVar18 = *(uint *)&ssl->conf->field_0x174, (uVar18 & 2) == 0 ||
                 ((pmVar25->flags & 4) == 0)))) &&
               (((uVar18 & 0x40) == 0 || (pmVar25->cipher != MBEDTLS_CIPHER_ARC4_128)))) {
              iVar16 = mbedtls_ssl_ciphersuite_uses_ec(pmVar25);
              if (iVar16 != 0) {
                ppmVar29 = ssl->handshake->curves;
                bVar51 = true;
                if ((ppmVar29 == (mbedtls_ecp_curve_info **)0x0) ||
                   (bVar51 = true, *ppmVar29 == (mbedtls_ecp_curve_info *)0x0)) goto LAB_0011a9a7;
              }
              iVar16 = mbedtls_ssl_ciphersuite_uses_psk(pmVar25);
              if (((iVar16 == 0) ||
                  (pmVar36 = ssl->conf,
                  pmVar36->f_psk !=
                  (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0)) ||
                 ((((bVar51 = true, pmVar36->psk != (uchar *)0x0 &&
                    (pmVar36->psk_identity != (uchar *)0x0)) && (pmVar36->psk_identity_len != 0)) &&
                  (pmVar36->psk_len != 0)))) {
                if ((*piVar48 == 3) &&
                   (mVar20 = mbedtls_ssl_get_ciphersuite_sig_alg(pmVar25), mVar20 != MBEDTLS_PK_NONE
                   )) {
                  mVar19 = mbedtls_ssl_sig_hash_set_find(&ssl->handshake->hash_algs,mVar20);
                  bVar51 = true;
                  if (mVar19 == MBEDTLS_MD_NONE) goto LAB_0011a9a7;
                }
                mVar20 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(pmVar25);
                pmVar42 = ssl->handshake->sni_key_cert;
                if (pmVar42 == (mbedtls_ssl_key_cert *)0x0) {
                  pmVar42 = ssl->conf->key_cert;
                }
                if (mVar20 == MBEDTLS_PK_NONE) {
LAB_0011abd6:
                  ssl->session_negotiate->ciphersuite = piVar5[(long)local_148];
                  ssl->transform_negotiate->ciphersuite_info = pmVar25;
                  ssl->state = ssl->state + 1;
                  if ((ssl->conf->field_0x174 & 2) != 0) {
                    mbedtls_ssl_recv_flight_completed(ssl);
                    return 0;
                  }
                  return 0;
                }
                if (pmVar42 != (mbedtls_ssl_key_cert *)0x0) {
                  local_150 = (mbedtls_ssl_key_cert *)0x0;
                  for (; pmVar10 = local_150, pmVar42 != (mbedtls_ssl_key_cert *)0x0;
                      pmVar42 = pmVar42->next) {
                    iVar16 = mbedtls_pk_can_do(pmVar42->key,mVar20);
                    if ((iVar16 != 0) &&
                       (iVar16 = mbedtls_ssl_check_cert_usage
                                           (pmVar42->cert,pmVar25,1,(uint32_t *)&tlen), iVar16 == 0)
                       ) {
                      if (mVar20 == MBEDTLS_PK_ECDSA) {
                        ppmVar29 = ssl->handshake->curves;
                        do {
                          pmVar30 = *ppmVar29;
                          if (pmVar30 == (mbedtls_ecp_curve_info *)0x0) goto LAB_0011ab0b;
                          ppmVar29 = ppmVar29 + 1;
                        } while (pmVar30->grp_id != *pmVar42->key->pk_ctx);
                      }
                      pmVar10 = pmVar42;
                      if (2 < *piVar48) break;
                      if (pmVar42->cert->sig_md == MBEDTLS_MD_SHA1) goto LAB_0011abc6;
                      if (local_150 == (mbedtls_ssl_key_cert *)0x0) {
                        local_150 = pmVar42;
                      }
                    }
LAB_0011ab0b:
                  }
                  local_150 = pmVar10;
                  pmVar42 = local_150;
                  if (local_150 != (mbedtls_ssl_key_cert *)0x0) {
LAB_0011abc6:
                    local_150 = pmVar42;
                    ssl->handshake->key_cert = local_150;
                    goto LAB_0011abd6;
                  }
                }
                bVar51 = true;
              }
            }
          }
LAB_0011a9a7:
          puVar49 = puVar49 + 2;
        }
        local_148 = (uchar *)((long)local_148 + 1);
      } while( true );
    }
    if ((iVar16 != 1 || (int)local_108 != 0) &&
       ((pmVar36 = ssl->conf, iVar16 != 0 ||
        ((int)local_108 != 1 && (pmVar36->field_0x174 & 0x30) != 0)))) goto LAB_0011a928;
  }
LAB_0011a911:
  uVar12 = '(';
  goto LAB_0011a0cb;
}

Assistant:

int mbedtls_ssl_handshake_server_step( mbedtls_ssl_context *ssl )
{
    int ret = 0;

    if( ssl->state == MBEDTLS_SSL_HANDSHAKE_OVER || ssl->handshake == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "server state: %d", ssl->state ) );

    if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
        return( ret );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING )
    {
        if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
            return( ret );
    }
#endif

    switch( ssl->state )
    {
        case MBEDTLS_SSL_HELLO_REQUEST:
            ssl->state = MBEDTLS_SSL_CLIENT_HELLO;
            break;

        /*
         *  <==   ClientHello
         */
        case MBEDTLS_SSL_CLIENT_HELLO:
            ret = ssl_parse_client_hello( ssl );
            break;

#if defined(MBEDTLS_SSL_PROTO_DTLS)
        case MBEDTLS_SSL_SERVER_HELLO_VERIFY_REQUEST_SENT:
            return( MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED );
#endif

        /*
         *  ==>   ServerHello
         *        Certificate
         *      ( ServerKeyExchange  )
         *      ( CertificateRequest )
         *        ServerHelloDone
         */
        case MBEDTLS_SSL_SERVER_HELLO:
            ret = ssl_write_server_hello( ssl );
            break;

        case MBEDTLS_SSL_SERVER_CERTIFICATE:
            ret = mbedtls_ssl_write_certificate( ssl );
            break;

        case MBEDTLS_SSL_SERVER_KEY_EXCHANGE:
            ret = ssl_write_server_key_exchange( ssl );
            break;

        case MBEDTLS_SSL_CERTIFICATE_REQUEST:
            ret = ssl_write_certificate_request( ssl );
            break;

        case MBEDTLS_SSL_SERVER_HELLO_DONE:
            ret = ssl_write_server_hello_done( ssl );
            break;

        /*
         *  <== ( Certificate/Alert  )
         *        ClientKeyExchange
         *      ( CertificateVerify  )
         *        ChangeCipherSpec
         *        Finished
         */
        case MBEDTLS_SSL_CLIENT_CERTIFICATE:
            ret = mbedtls_ssl_parse_certificate( ssl );
            break;

        case MBEDTLS_SSL_CLIENT_KEY_EXCHANGE:
            ret = ssl_parse_client_key_exchange( ssl );
            break;

        case MBEDTLS_SSL_CERTIFICATE_VERIFY:
            ret = ssl_parse_certificate_verify( ssl );
            break;

        case MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC:
            ret = mbedtls_ssl_parse_change_cipher_spec( ssl );
            break;

        case MBEDTLS_SSL_CLIENT_FINISHED:
            ret = mbedtls_ssl_parse_finished( ssl );
            break;

        /*
         *  ==> ( NewSessionTicket )
         *        ChangeCipherSpec
         *        Finished
         */
        case MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC:
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
            if( ssl->handshake->new_session_ticket != 0 )
                ret = ssl_write_new_session_ticket( ssl );
            else
#endif
                ret = mbedtls_ssl_write_change_cipher_spec( ssl );
            break;

        case MBEDTLS_SSL_SERVER_FINISHED:
            ret = mbedtls_ssl_write_finished( ssl );
            break;

        case MBEDTLS_SSL_FLUSH_BUFFERS:
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "handshake: done" ) );
            ssl->state = MBEDTLS_SSL_HANDSHAKE_WRAPUP;
            break;

        case MBEDTLS_SSL_HANDSHAKE_WRAPUP:
            mbedtls_ssl_handshake_wrapup( ssl );
            break;

        default:
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "invalid state %d", ssl->state ) );
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    return( ret );
}